

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::ParseTableProduction::PrintLookAhead
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv)

{
  bool bVar1;
  bool bVar2;
  reference puVar3;
  mapped_type *ppbVar4;
  String local_b8;
  String local_98;
  uint local_78;
  uint terminal;
  uint local_64;
  iterator iStack_60;
  uint iTerminal;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  string local_40 [7];
  bool flag;
  String dest;
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *pgrammarSymbolsInv_local;
  String *str_local;
  ParseTableProduction *this_local;
  
  dest.field_2._8_8_ = pgrammarSymbolsInv;
  std::__cxx11::string::string(local_40);
  bVar1 = false;
  __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (&this->LookAhead);
  iStack_60 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&this->LookAhead);
  while (bVar2 = std::operator!=(&__end2,&stack0xffffffffffffffa0), bVar2) {
    puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
    local_64 = *puVar3;
    if (bVar1) {
      std::__cxx11::string::operator+=(local_40," ");
    }
    bVar1 = true;
    local_78 = local_64 & 0xfffffff;
    if (dest.field_2._8_8_ == 0) {
      if (local_78 == 1) {
        std::__cxx11::string::operator+=(local_40,"EOF");
      }
      else if (local_78 < 0x22) {
        StringWithFormat<char>(&local_98,"x%02X",(ulong)local_78);
        std::__cxx11::string::operator+=(local_40,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        StringWithFormat<char>(&local_b8,"%c",(ulong)(uint)(int)(char)((char)local_78 + -2));
        std::__cxx11::string::operator+=(local_40,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
    }
    else if (local_78 == 1) {
      std::__cxx11::string::operator+=(local_40,"EOF");
    }
    else {
      ppbVar4 = std::
                map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                ::operator[]((map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                              *)dest.field_2._8_8_,&local_64);
      std::__cxx11::string::operator+=(local_40,(string *)*ppbVar4);
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
  }
  std::__cxx11::string::swap((string *)str);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ParseTableProduction::PrintLookAhead(String& str,
                                   std::map<unsigned, const String*>* pgrammarSymbolsInv) const {
    String dest;
    bool   flag = false;

    for (const auto iTerminal : LookAhead) {
        if (flag)
            dest += " ";
        flag = true;

        const auto terminal = iTerminal & ProductionMask::TerminalValue;

        if (pgrammarSymbolsInv) {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else
                dest += *(*pgrammarSymbolsInv)[iTerminal];
        } else {
            if (terminal == TokenCode::TokenEOF)
                dest += "EOF";
            else if (terminal < 32u + TokenCode::TokenFirstID)
                dest += StringWithFormat("x%02X", terminal);
            else
                dest += StringWithFormat("%c", char(terminal - TokenCode::TokenFirstID));
        }
    }

    str.swap(dest);
}